

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22ecb::RcExternMethodsInterfaceTest::TestCreateRateControl
          (RcExternMethodsInterfaceTest *this)

{
  bool bVar1;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  AomAV1RateControlRTC *controller;
  AomAV1RateControlRtcConfig *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar2;
  AomAV1RateControlRTC **in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  Type type;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  av1_ratecontrol_rtc_create(in_stack_ffffffffffffffa8);
  type = kSuccess;
  testing::internal::CmpHelperNE<AomAV1RateControlRTC*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (void **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x138945);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffe0,type,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc0);
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    testing::Message::~Message((Message *)0x138991);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1389f1);
  if (uVar2 == 0) {
    av1_ratecontrol_rtc_destroy((AomAV1RateControlRTC *)(ulong)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void RcExternMethodsInterfaceTest::TestCreateRateControl() {
  AomAV1RateControlRTC *controller = av1_ratecontrol_rtc_create(&rc_cfg_);

  ASSERT_NE(controller, nullptr);

  av1_ratecontrol_rtc_destroy(controller);
}